

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

LY_ERR lysp_check_dup_identities(lysp_ctx *ctx,lysp_module *mod)

{
  LY_ERR LVar1;
  ly_ht *ht;
  ulong uVar2;
  lysp_include *plVar3;
  ulong uVar4;
  lysp_ident *plVar5;
  lysp_ident *plVar6;
  lysp_ident *plVar7;
  
  LVar1 = LY_EMEM;
  ht = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht != (ly_ht *)0x0) {
    plVar7 = mod->identities;
    plVar6 = plVar7;
    for (plVar5 = plVar7;
        (plVar6 != (lysp_ident *)0x0 &&
        ((ulong)((long)plVar5 - (long)plVar6) / 0x38 < *(ulong *)&plVar6[-1].flags));
        plVar5 = plVar5 + 1) {
      LVar1 = lysp_check_dup_ht_insert
                        (ctx,ht,plVar7->name,"identity",
                         "name collision with another top-level identity");
      if (LVar1 != LY_SUCCESS) goto LAB_00160941;
      plVar7 = plVar7 + 1;
      plVar6 = mod->identities;
    }
    plVar3 = mod->includes;
    uVar4 = 0;
    while( true ) {
      if (plVar3 == (lysp_include *)0x0) {
        uVar2 = 0;
      }
      else {
        uVar2 = *(ulong *)(plVar3[-1].rev + 8);
      }
      if (uVar2 <= uVar4) break;
      plVar7 = (plVar3[uVar4].submodule)->identities;
      if ((plVar7 != (lysp_ident *)0x0) && (plVar6 = plVar7, *(long *)&plVar7[-1].flags != 0)) {
        do {
          plVar6 = plVar6 + 1;
          LVar1 = lysp_check_dup_ht_insert
                            (ctx,ht,plVar7->name,"identity",
                             "name collision with another top-level identity");
          if (LVar1 != LY_SUCCESS) goto LAB_00160941;
          plVar3 = mod->includes;
          plVar5 = (plVar3[uVar4].submodule)->identities;
        } while ((plVar5 != (lysp_ident *)0x0) &&
                (plVar7 = plVar7 + 1,
                (ulong)((long)plVar6 - (long)plVar5) / 0x38 < *(ulong *)&plVar5[-1].flags));
      }
      uVar4 = uVar4 + 1;
    }
    LVar1 = LY_SUCCESS;
LAB_00160941:
    lyht_free(ht,(_func_void_void_ptr *)0x0);
  }
  return LVar1;
}

Assistant:

LY_ERR
lysp_check_dup_identities(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_ident *i;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module identities into a hash table */
    LY_ARRAY_FOR(mod->identities, struct lysp_ident, i) {
        ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                "name collision with another top-level identity");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule identities into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->identities, struct lysp_ident, i) {
            ret = lysp_check_dup_ht_insert(ctx, ht, i->name, "identity",
                    "name collision with another top-level identity");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}